

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void multi_thread_server(int port,string *ip,string *log_file)

{
  int port_00;
  int sockfd;
  Pass2thread *this;
  pthread_t local_a0;
  pthread_t tid;
  client_socket local_90;
  Pass2thread *local_60;
  Pass2thread *arg;
  string local_48 [32];
  int local_28;
  int local_24;
  int listened_sockfd;
  int client_num;
  string *log_file_local;
  string *ip_local;
  int port_local;
  
  local_24 = 0;
  _listened_sockfd = log_file;
  log_file_local = ip;
  ip_local._4_4_ = port;
  sockfd = C_std::Network::Socket(2,1,0);
  port_00 = ip_local._4_4_;
  local_28 = sockfd;
  std::__cxx11::string::string(local_48,(string *)log_file_local);
  C_std::Network::easy_bind(sockfd,port_00,(string *)local_48);
  std::__cxx11::string::~string(local_48);
  C_std::Network::Listen(local_28,0x80);
  do {
    local_24 = local_24 + 1;
    this = (Pass2thread *)operator_new(0x68);
    tid._7_1_ = 1;
    C_std::Network::easy_accept(&local_90,local_28);
    Pass2thread::Pass2thread(this,&local_90,_listened_sockfd,local_24);
    tid._7_1_ = 0;
    C_std::Network::client_socket::~client_socket(&local_90);
    local_60 = this;
    POSIX::multithreading::Pthread_create(&local_a0,(pthread_attr_t *)0x0,start_routine,this);
    POSIX::multithreading::Pthread_detach(local_a0);
  } while( true );
}

Assistant:

void multi_thread_server(int port, const std::string &ip, const std::string &log_file) {
    using namespace POSIX::multithreading;
    int client_num = 0;

    int listened_sockfd = Socket(AF_INET, SOCK_STREAM, 0);
    easy_bind(listened_sockfd, port, ip);
    Listen(listened_sockfd, 128);
    while (1) {
        ++client_num;
        Pass2thread *arg = new Pass2thread(easy_accept(listened_sockfd), log_file, client_num);
        pthread_t tid;
        Pthread_create(&tid, 0, start_routine, arg);
        Pthread_detach(tid);
    }
}